

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O2

void my_do_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Object inter;
  Am_Value value;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_Value::operator=(&value,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n+-+-+- Command ");
  poVar2 = (ostream *)operator<<(poVar2,cmd);
  poVar2 = std::operator<<(poVar2," for inter ");
  poVar2 = (ostream *)operator<<(poVar2,&inter);
  poVar2 = std::operator<<(poVar2," value = ");
  poVar2 = (ostream *)operator<<(poVar2,&value);
  std::operator<<(poVar2," type ");
  Am_Print_Type((ostream *)&std::cout,value.type);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::ostream::flush();
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, my_do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value value;
  value = cmd.Peek(Am_VALUE);
  cout << "\n+-+-+- Command " << cmd << " for inter " << inter
       << " value = " << value << " type ";
  Am_Print_Type(cout, value.type);
  cout << endl << flush;
}